

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::load_param(Normalize *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->across_spatial = iVar1;
  iVar1 = ParamDict::get(pd,4,1);
  this->across_channel = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->channel_shared = iVar1;
  fVar2 = ParamDict::get(pd,2,0.0001);
  this->eps = fVar2;
  iVar1 = ParamDict::get(pd,3,0);
  this->scale_data_size = iVar1;
  return 0;
}

Assistant:

int Normalize::load_param(const ParamDict& pd)
{
    across_spatial = pd.get(0, 0);
    across_channel = pd.get(4, 1);
    channel_shared = pd.get(1, 0);
    eps = pd.get(2, 0.0001f);
    scale_data_size = pd.get(3, 0);

    return 0;
}